

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

csc * csc_spalloc(c_int m,c_int n,c_int nzmax,c_int values,c_int triplet)

{
  int iVar1;
  c_int *pcVar2;
  c_float *pcVar3;
  long in_RCX;
  long in_RDX;
  c_int in_RSI;
  c_int in_RDI;
  long in_R8;
  csc *A;
  c_int in_stack_ffffffffffffffa8;
  c_int in_stack_ffffffffffffffb0;
  c_int local_40;
  csc *local_8;
  
  local_8 = (csc *)csc_calloc(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (local_8 == (csc *)0x0) {
    local_8 = (csc *)0x0;
  }
  else {
    local_8->m = in_RDI;
    local_8->n = in_RSI;
    local_40 = in_RDX;
    if (in_RDX < 2) {
      local_40 = 1;
    }
    local_8->nzmax = local_40;
    iVar1 = -1;
    if (in_R8 != 0) {
      iVar1 = 0;
    }
    local_8->nz = (long)iVar1;
    pcVar2 = (c_int *)csc_malloc(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    local_8->p = pcVar2;
    pcVar2 = (c_int *)csc_malloc(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    local_8->i = pcVar2;
    if (in_RCX == 0) {
      pcVar3 = (c_float *)0x0;
    }
    else {
      pcVar3 = (c_float *)csc_malloc(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    local_8->x = pcVar3;
    if (((local_8->p == (c_int *)0x0) || (local_8->i == (c_int *)0x0)) ||
       ((in_RCX != 0 && (local_8->x == (c_float *)0x0)))) {
      csc_spfree((csc *)0x274277);
      local_8 = (csc *)0x0;
    }
  }
  return local_8;
}

Assistant:

csc* csc_spalloc(c_int m, c_int n, c_int nzmax, c_int values, c_int triplet) {
  csc *A = csc_calloc(1, sizeof(csc)); /* allocate the csc struct */

  if (!A) return OSQP_NULL;            /* out of memory */

  A->m     = m;                        /* define dimensions and nzmax */
  A->n     = n;
  A->nzmax = nzmax = c_max(nzmax, 1);
  A->nz    = triplet ? 0 : -1;         /* allocate triplet or comp.col */
  A->p     = csc_malloc(triplet ? nzmax : n + 1, sizeof(c_int));
  A->i     = csc_malloc(nzmax,  sizeof(c_int));
  A->x     = values ? csc_malloc(nzmax,  sizeof(c_float)) : OSQP_NULL;
  if (!A->p || !A->i || (values && !A->x)){
    csc_spfree(A);
    return OSQP_NULL;
  } else return A;
}